

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

string * Util::writeXmlAttribute<bool>
                   (string *__return_storage_ptr__,stringstream *str,string *attr,bool value)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(str + 0x10)," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(str + 0x10),(attr->_M_dataplus)._M_p,attr->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

static std::string writeXmlAttribute(std::stringstream &str, std::string attr, T value)
	{
		str << " " << attr << "=\"" << value << "\"";
		return str.str();
	}